

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O0

IterateResult __thiscall
gl3cts::TransformFeedback::CaptureGeometryInterleaved::iterate(CaptureGeometryInterleaved *this)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  ContextInfo *pCVar4;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *this_02;
  byte local_1fb;
  byte local_1f9;
  byte local_1e1;
  byte local_1d9;
  MessageBuilder local_1d0;
  int local_4c;
  uint local_48;
  GLint i_bind_case;
  GLuint i_primitive_case;
  byte local_34;
  byte local_33;
  undefined1 local_32;
  byte local_31;
  deUint32 local_30;
  bool test_error;
  bool is_ok;
  bool is_arb_gs_4;
  bool is_ext_tf_1;
  byte local_25;
  deUint32 local_24;
  ApiType AStack_20;
  bool is_at_least_gl_32;
  byte local_19;
  long lStack_18;
  bool is_at_least_gl_30;
  Functions *gl;
  CaptureGeometryInterleaved *this_local;
  
  gl = (Functions *)this;
  pRVar3 = deqp::Context::getRenderContext
                     (*(Context **)
                       (&this->field_0x78 + (long)this->_vptr_CaptureGeometryInterleaved[-3]));
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lStack_18 = CONCAT44(extraout_var,iVar1);
  pRVar3 = deqp::Context::getRenderContext
                     (*(Context **)
                       (&this->field_0x78 + (long)this->_vptr_CaptureGeometryInterleaved[-3]));
  AStack_20.m_bits = (*pRVar3->_vptr_RenderContext[2])();
  local_24 = (deUint32)glu::ApiType::core(3,0);
  local_19 = glu::contextSupports((ContextType)AStack_20.m_bits,(ApiType)local_24);
  pRVar3 = deqp::Context::getRenderContext
                     (*(Context **)
                       (&this->field_0x78 + (long)this->_vptr_CaptureGeometryInterleaved[-3]));
  _test_error = (*pRVar3->_vptr_RenderContext[2])();
  local_30 = (deUint32)glu::ApiType::core(3,2);
  local_25 = glu::contextSupports((ContextType)_test_error,(ApiType)local_30);
  pCVar4 = deqp::Context::getContextInfo
                     (*(Context **)
                       (&this->field_0x78 + (long)this->_vptr_CaptureGeometryInterleaved[-3]));
  local_31 = glu::ContextInfo::isExtensionSupported(pCVar4,"GL_EXT_transform_feedback");
  pCVar4 = deqp::Context::getContextInfo
                     (*(Context **)
                       (&this->field_0x78 + (long)this->_vptr_CaptureGeometryInterleaved[-3]));
  local_32 = glu::ContextInfo::isExtensionSupported(pCVar4,"GL_ARB_geometry_shader4");
  local_33 = 1;
  local_34 = 0;
  if ((((local_19 & 1) != 0) || ((local_31 & 1) != 0)) &&
     (((local_25 & 1) != 0 || ((bool)local_32)))) {
    (*this->_vptr_CaptureGeometryInterleaved[3])();
    CaptureVertexInterleaved::createFramebuffer
              ((CaptureVertexInterleaved *)
               ((long)&this->_vptr_CaptureGeometryInterleaved +
               (long)this->_vptr_CaptureGeometryInterleaved[-3]));
    (**(code **)(*(long *)((long)&this->_vptr_CaptureGeometryInterleaved +
                          (long)this->_vptr_CaptureGeometryInterleaved[-3]) + 0x38))
              ((_func_int *)
               ((long)&this->_vptr_CaptureGeometryInterleaved +
               (long)this->_vptr_CaptureGeometryInterleaved[-3]));
    CaptureVertexInterleaved::createVertexArrayObject
              ((CaptureVertexInterleaved *)
               ((long)&this->_vptr_CaptureGeometryInterleaved +
               (long)this->_vptr_CaptureGeometryInterleaved[-3]));
    local_48 = 0;
    while( true ) {
      local_1d9 = 0;
      if (local_48 < 3) {
        local_1d9 = local_33;
      }
      if ((local_1d9 & 1) == 0) break;
      (*this->_vptr_CaptureGeometryInterleaved[4])(this,(ulong)local_48);
      (**(code **)(lStack_18 + 0x1680))
                (*(undefined4 *)
                  (&this->field_0x80 + (long)this->_vptr_CaptureGeometryInterleaved[-3]));
      dVar2 = (**(code **)(lStack_18 + 0x800))();
      glu::checkError(dVar2,"glUseProgram call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0xb6f);
      local_4c = 0;
      while( true ) {
        local_1e1 = 0;
        if (local_4c < 3) {
          local_1e1 = local_33;
        }
        if ((local_1e1 & 1) == 0) break;
        if ((local_4c != 2) ||
           (*(long *)(&this->field_0xa8 + (long)this->_vptr_CaptureGeometryInterleaved[-3]) != 0)) {
          (**(code **)(*(long *)((long)&this->_vptr_CaptureGeometryInterleaved +
                                (long)this->_vptr_CaptureGeometryInterleaved[-3]) + 0x58))
                    ((_func_int *)
                     ((long)&this->_vptr_CaptureGeometryInterleaved +
                     (long)this->_vptr_CaptureGeometryInterleaved[-3]),local_4c);
          (*this->_vptr_CaptureGeometryInterleaved[5])(this,(ulong)local_48);
          local_1f9 = 0;
          if ((local_33 & 1) != 0) {
            local_1f9 = (**(code **)(*(long *)((long)&this->_vptr_CaptureGeometryInterleaved +
                                              (long)this->_vptr_CaptureGeometryInterleaved[-3]) +
                                    0x48))((_func_int *)
                                           ((long)&this->_vptr_CaptureGeometryInterleaved +
                                           (long)this->_vptr_CaptureGeometryInterleaved[-3]),
                                           CaptureVertexInterleaved::s_primitive_cases[local_48]);
          }
          local_33 = local_1f9 & 1;
          local_1fb = 0;
          if (local_33 != 0) {
            local_1fb = (**(code **)(*(long *)((long)&this->_vptr_CaptureGeometryInterleaved +
                                              (long)this->_vptr_CaptureGeometryInterleaved[-3]) +
                                    0x50))((_func_int *)
                                           ((long)&this->_vptr_CaptureGeometryInterleaved +
                                           (long)this->_vptr_CaptureGeometryInterleaved[-3]),
                                           local_4c,s_geometry_interleaved_primitive_cases_xfb
                                                    [local_48]);
          }
          local_33 = local_1fb & 1;
        }
        local_4c = local_4c + 1;
      }
      (**(code **)(lStack_18 + 0x448))
                (*(undefined4 *)
                  (&this->field_0x80 + (long)this->_vptr_CaptureGeometryInterleaved[-3]));
      *(undefined4 *)(&this->field_0x80 + (long)this->_vptr_CaptureGeometryInterleaved[-3]) = 0;
      dVar2 = (**(code **)(lStack_18 + 0x800))();
      glu::checkError(dVar2,"glDeleteProgram call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                      ,0xb86);
      local_48 = local_48 + 1;
    }
  }
  (**(code **)(*(long *)((long)&this->_vptr_CaptureGeometryInterleaved +
                        (long)this->_vptr_CaptureGeometryInterleaved[-3]) + 0x60))
            ((_func_int *)
             ((long)&this->_vptr_CaptureGeometryInterleaved +
             (long)this->_vptr_CaptureGeometryInterleaved[-3]));
  if ((local_33 & 1) == 0) {
    if ((local_34 & 1) == 0) {
      tcu::TestContext::setTestResult
                (*(TestContext **)
                  (&this->field_0x8 + (long)this->_vptr_CaptureGeometryInterleaved[-3]),
                 QP_TEST_RESULT_FAIL,"Fail");
    }
    else {
      tcu::TestContext::setTestResult
                (*(TestContext **)
                  (&this->field_0x8 + (long)this->_vptr_CaptureGeometryInterleaved[-3]),
                 QP_TEST_RESULT_INTERNAL_ERROR,"Error");
    }
  }
  else {
    this_00 = deqp::Context::getTestContext
                        (*(Context **)
                          (&this->field_0x78 + (long)this->_vptr_CaptureGeometryInterleaved[-3]));
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_1d0,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    this_02 = tcu::MessageBuilder::operator<<
                        (&local_1d0,(char (*) [30])"Capture Geometry have passed.");
    tcu::MessageBuilder::operator<<(this_02,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1d0);
    tcu::TestContext::setTestResult
              (*(TestContext **)
                (&this->field_0x8 + (long)this->_vptr_CaptureGeometryInterleaved[-3]),
               QP_TEST_RESULT_PASS,"Pass");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult gl3cts::TransformFeedback::CaptureGeometryInterleaved::iterate(void)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Initializations. */
	bool is_at_least_gl_30 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(3, 0)));
	bool is_at_least_gl_32 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(3, 2)));
	bool is_ext_tf_1	   = m_context.getContextInfo().isExtensionSupported("GL_EXT_transform_feedback");
	bool is_arb_gs_4	   = m_context.getContextInfo().isExtensionSupported("GL_ARB_geometry_shader4");

	bool is_ok		= true;
	bool test_error = false;

	/* Tests. */
	try
	{
		if ((is_at_least_gl_30 || is_ext_tf_1) && (is_at_least_gl_32 || is_arb_gs_4))
		{
			fetchLimits();
			createFramebuffer();
			createTransformFeedbackBuffer();
			createVertexArrayObject();

			for (glw::GLuint i_primitive_case = 0;
				 (i_primitive_case < s_geometry_interleaved_primitive_cases_count) && is_ok; ++i_primitive_case)
			{
				buildProgram(i_primitive_case);

				gl.useProgram(m_program);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram call failed.");

				for (glw::GLint i_bind_case = 0; (i_bind_case < BIND_BUFFER_CASES_COUNT) && is_ok; ++i_bind_case)
				{
					if ((i_bind_case == BIND_BUFFER_OFFSET_CASE) && (DE_NULL == m_glBindBufferOffsetEXT))
					{
						continue;
					}

					bindBuffer((BindBufferCase)i_bind_case);

					draw(i_primitive_case);

					is_ok = is_ok && checkFramebuffer(s_primitive_cases[i_primitive_case]);
					is_ok = is_ok &&
							checkTransformFeedbackBuffer((BindBufferCase)i_bind_case,
														 s_geometry_interleaved_primitive_cases_xfb[i_primitive_case]);
				}

				gl.deleteProgram(m_program);

				m_program = 0;

				GLU_EXPECT_NO_ERROR(gl.getError(), "glDeleteProgram call failed.");
			}
		}
	}
	catch (...)
	{
		is_ok	  = false;
		test_error = true;
	}

	/* Clean objects. */
	clean();

	/* Result's setup. */
	if (is_ok)
	{
		/* Log success. */
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Capture Geometry have passed."
											<< tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (test_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}